

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_limit_h(REF_DBL *metric,REF_GRID ref_grid,REF_DBL hmin,REF_DBL hmax)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  undefined8 uVar4;
  char *pcVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  undefined1 local_98 [16];
  double local_88;
  
  dVar8 = 1.0 / (hmin * hmin);
  dVar7 = 1.0 / (hmax * hmax);
  lVar6 = 0;
  do {
    if (ref_grid->node->max <= lVar6) {
      return 0;
    }
    if (-1 < ref_grid->node->global[lVar6]) {
      uVar3 = ref_matrix_diag_m(metric,(REF_DBL *)local_98);
      if (uVar3 != 0) {
        pcVar5 = "eigen decomp";
        uVar4 = 0x83e;
LAB_001af567:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar4,"ref_metric_limit_h",(ulong)uVar3,pcVar5);
        return uVar3;
      }
      if ((0.0 < hmin) &&
         (auVar1._8_8_ = dVar8, auVar1._0_8_ = dVar8, local_98 = minpd(local_98,auVar1),
         dVar8 <= local_88)) {
        local_88 = dVar8;
      }
      if ((0.0 < hmax) &&
         (auVar2._8_8_ = dVar7, auVar2._0_8_ = dVar7, local_98 = maxpd(local_98,auVar2),
         local_88 <= dVar7)) {
        local_88 = dVar7;
      }
      uVar3 = ref_matrix_form_m((REF_DBL *)local_98,metric);
      if (uVar3 != 0) {
        pcVar5 = "reform m";
        uVar4 = 0x84b;
        goto LAB_001af567;
      }
    }
    lVar6 = lVar6 + 1;
    metric = metric + 6;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_limit_h(REF_DBL *metric, REF_GRID ref_grid,
                                      REF_DBL hmin, REF_DBL hmax) {
  REF_DBL diag_system[12];
  REF_DBL eig;
  REF_INT node;
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "eigen decomp");
    if (hmin > 0.0) {
      eig = 1.0 / (hmin * hmin);
      ref_matrix_eig(diag_system, 0) = MIN(ref_matrix_eig(diag_system, 0), eig);
      ref_matrix_eig(diag_system, 1) = MIN(ref_matrix_eig(diag_system, 1), eig);
      ref_matrix_eig(diag_system, 2) = MIN(ref_matrix_eig(diag_system, 2), eig);
    }
    if (hmax > 0.0) {
      eig = 1.0 / (hmax * hmax);
      ref_matrix_eig(diag_system, 0) = MAX(ref_matrix_eig(diag_system, 0), eig);
      ref_matrix_eig(diag_system, 1) = MAX(ref_matrix_eig(diag_system, 1), eig);
      ref_matrix_eig(diag_system, 2) = MAX(ref_matrix_eig(diag_system, 2), eig);
    }
    RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform m");
  }
  return REF_SUCCESS;
}